

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O0

void movaps_VW(PDISASM pMyDisasm)

{
  _Bool _Var1;
  PDISASM pMyDisasm_local;
  
  if ((pMyDisasm->Reserved_).VEX.state == '\x01') {
    if ((pMyDisasm->Reserved_).VEX.pp == '\0') {
      if (((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).EVEX.W == '\x01')
         ) {
        failDecode(pMyDisasm);
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vmovaps");
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
        }
        vex_GxEx(pMyDisasm);
      }
    }
    else if ((pMyDisasm->Reserved_).VEX.pp == '\x01') {
      if (((pMyDisasm->Reserved_).EVEX.state == '\x01') && ((pMyDisasm->Reserved_).EVEX.W == '\0'))
      {
        failDecode(pMyDisasm);
      }
      else {
        strcpy((pMyDisasm->Instruction).Mnemonic,"vmovapd");
        if ((pMyDisasm->Reserved_).EVEX.state == '\x01') {
          (pMyDisasm->Reserved_).EVEX.tupletype = '\x03';
        }
        vex_GxEx(pMyDisasm);
      }
    }
    else {
      failDecode(pMyDisasm);
    }
  }
  else if ((pMyDisasm->Prefix).OperandSize == '\x01') {
    (pMyDisasm->Reserved_).OperandSize = (pMyDisasm->Reserved_).OriginalOperandSize;
    (pMyDisasm->Prefix).OperandSize = '\b';
    (pMyDisasm->Reserved_).MemDecoration = 0x6d;
    (pMyDisasm->Instruction).Category = 0x50001;
    strcpy((pMyDisasm->Instruction).Mnemonic,"movapd");
    (pMyDisasm->Reserved_).Register_ = 4;
    GxEx(pMyDisasm);
  }
  else {
    _Var1 = prefixes_present(pMyDisasm);
    if (_Var1) {
      failDecode(pMyDisasm);
    }
    else {
      (pMyDisasm->Reserved_).MemDecoration = 0x6d;
      (pMyDisasm->Instruction).Category = 0x50001;
      strcpy((pMyDisasm->Instruction).Mnemonic,"movaps");
      (pMyDisasm->Reserved_).Register_ = 4;
      GxEx(pMyDisasm);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ movaps_VW(PDISASM pMyDisasm)
{
 if (GV.VEX.state == InUsePrefix) {
   if (GV.VEX.pp == 0) {
     if (
         (GV.EVEX.state == InUsePrefix) &&
         (GV.EVEX.W == 1)
       ) {
       failDecode(pMyDisasm);
       return;
     }
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovaps");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
     vex_GxEx(pMyDisasm);

   }
   else if (GV.VEX.pp == 1) {
     if (
         (GV.EVEX.state == InUsePrefix) &&
         (GV.EVEX.W == 0)
       ) {
       failDecode(pMyDisasm);
       return;
     }
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "vmovapd");
     #endif
     if (GV.EVEX.state == InUsePrefix) GV.EVEX.tupletype = FULL_MEM;
     vex_GxEx(pMyDisasm);

   }
   else {
     failDecode(pMyDisasm);
   }
 }
 else {
   /* ========== 0x66 */
   if (pMyDisasm->Prefix.OperandSize == InUsePrefix) {
     GV.OperandSize = GV.OriginalOperandSize;
     pMyDisasm->Prefix.OperandSize = MandatoryPrefix;
     GV.MemDecoration = Arg2_m128_xmm;
     pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+DATA_TRANSFER;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movapd");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

   }
   else {
     if (prefixes_present(pMyDisasm)) { failDecode(pMyDisasm); return; }
     GV.MemDecoration = Arg2_m128_xmm;
     pMyDisasm->Instruction.Category = SSE2_INSTRUCTION+DATA_TRANSFER;
     #ifndef BEA_LIGHT_DISASSEMBLY
        (void) strcpy (pMyDisasm->Instruction.Mnemonic, "movaps");
     #endif
     GV.Register_ = SSE_REG;
     GxEx(pMyDisasm);

   }

 }
}